

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void Catch::enforceNoDuplicateTestCases
               (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *functions)

{
  bool bVar1;
  reference this;
  string *msg;
  pointer this_00;
  undefined8 in_RDI;
  pair<std::_Rb_tree_const_iterator<Catch::TestCase>,_bool> pVar2;
  pair<std::_Rb_tree_const_iterator<Catch::TestCase>,_bool> prev;
  TestCase *function;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__range1;
  set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_> seenFunctions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  ReusableStringStream *in_stack_fffffffffffffef0;
  value_type *in_stack_ffffffffffffff08;
  set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
  *in_stack_ffffffffffffff10;
  ReusableStringStream *in_stack_ffffffffffffff20;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_48;
  undefined8 local_40;
  undefined8 local_8;
  
  local_8 = in_RDI;
  clara::std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::
  set((set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_> *)0x131a8c
     );
  local_40 = local_8;
  local_48._M_current =
       (TestCase *)
       clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                 ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                  in_stack_fffffffffffffee8);
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)in_stack_fffffffffffffee8)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                        *)in_stack_fffffffffffffef0,
                       (__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                        *)in_stack_fffffffffffffee8);
    if (!bVar1) {
      clara::std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
      ::~set((set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_> *)
             0x131cea);
      return;
    }
    this = __gnu_cxx::
           __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
           ::operator*(&local_48);
    pVar2 = clara::std::
            set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::
            insert(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&local_48);
  }
  ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffff20);
  ReusableStringStream::operator<<
            (in_stack_fffffffffffffef0,(char (*) [20])in_stack_fffffffffffffee8);
  ReusableStringStream::operator<<(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  ReusableStringStream::operator<<
            (in_stack_fffffffffffffef0,(char (*) [22])in_stack_fffffffffffffee8);
  msg = (string *)
        ReusableStringStream::operator<<
                  (in_stack_fffffffffffffef0,(char (*) [16])in_stack_fffffffffffffee8);
  this_00 = clara::std::_Rb_tree_const_iterator<Catch::TestCase>::operator->
                      ((_Rb_tree_const_iterator<Catch::TestCase> *)0x131bd7);
  TestCase::getTestCaseInfo(this_00);
  ReusableStringStream::operator<<
            (in_stack_fffffffffffffef0,(SourceLineInfo *)in_stack_fffffffffffffee8);
  ReusableStringStream::operator<<
            (in_stack_fffffffffffffef0,(char (*) [2])in_stack_fffffffffffffee8);
  ReusableStringStream::operator<<
            (in_stack_fffffffffffffef0,(char (*) [15])in_stack_fffffffffffffee8);
  TestCase::getTestCaseInfo(this);
  ReusableStringStream::operator<<
            (in_stack_fffffffffffffef0,(SourceLineInfo *)in_stack_fffffffffffffee8);
  ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffee8);
  throw_domain_error(msg);
}

Assistant:

void enforceNoDuplicateTestCases( std::vector<TestCase> const& functions ) {
        std::set<TestCase> seenFunctions;
        for( auto const& function : functions ) {
            auto prev = seenFunctions.insert( function );
            CATCH_ENFORCE( prev.second,
                    "error: TEST_CASE( \"" << function.name << "\" ) already defined.\n"
                    << "\tFirst seen at " << prev.first->getTestCaseInfo().lineInfo << "\n"
                    << "\tRedefined at " << function.getTestCaseInfo().lineInfo );
        }
    }